

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int preprocessInputBuffer
              (string *in_file_path,StkFrames *preprocess_buff,double dst_rate,double shifter_weight
              ,int centerBiasLevel,bool use_linearity_correction)

{
  uint nFrames;
  StkFloat *pSVar1;
  uint uVar2;
  int iVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  undefined8 in_XMM0_Qb;
  double dVar9;
  double dVar10;
  StkFloat SVar11;
  allocator local_119;
  double local_118;
  double local_110;
  double local_108;
  undefined8 uStack_100;
  double local_f0;
  double local_e8;
  undefined8 uStack_e0;
  StkFrames filtered_shifter_buff;
  string local_a8;
  StkFrames rectify_buff;
  StkFrames progress_out_buff;
  
  nFrames = (uint)preprocess_buff->size_;
  dVar8 = (double)centerBiasLevel;
  if ((int)CONCAT71(in_register_00000009,use_linearity_correction) != 0) {
    in_XMM0_Qb = 0;
    dVar8 = ((159.79 / (22638.0 / dVar8 + 100.0)) / 0.5771522095) * 128.0;
  }
  local_e8 = (double)(~-(ulong)(63.0 < dVar8) & (ulong)dVar8 |
                     (ulong)(dVar8 + -128.0) & -(ulong)(63.0 < dVar8));
  local_108 = local_e8 * -0.015625;
  local_118 = dst_rate;
  local_110 = shifter_weight;
  uStack_100 = in_XMM0_Qb;
  uStack_e0 = in_XMM0_Qb;
  stk::StkFrames::StkFrames(&rectify_buff,nFrames,1);
  pSVar1 = preprocess_buff->data_;
  uVar4 = 0;
  uVar7 = 0;
  if (0 < (int)nFrames) {
    uVar7 = (ulong)nFrames;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    dVar8 = pSVar1[uVar4];
    dVar9 = 0.0;
    if (0.0 <= local_e8) {
      if (dVar8 < local_108) {
        dVar9 = local_108 - dVar8;
      }
    }
    else if (local_108 <= dVar8) {
      dVar9 = dVar8 - local_108;
    }
    rectify_buff.data_[uVar4] = dVar9;
  }
  uVar2 = 0x800;
  if ((int)nFrames < 0x800) {
    uVar2 = nFrames;
  }
  uVar5 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar5;
  }
  local_f0 = 0.0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    local_f0 = local_f0 + rectify_buff.data_[uVar5] / (double)(int)uVar2;
  }
  if (force_initial_volume < 0) {
    dVar8 = local_f0 * 64.0;
  }
  else {
    dVar8 = (double)((uint)force_initial_volume >> 1);
  }
  iVar3 = (int)dVar8 * 2;
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    iVar3 = iVar3 + (uint)((double)iVar3 <
                          (double)((ulong)((rectify_buff.data_[uVar4] * 128.0) /
                                          (1.0 - ABS(local_108))) & -(ulong)(local_108 != 1.0) |
                                  ~-(ulong)(local_108 != 1.0) &
                                  (ulong)(rectify_buff.data_[uVar4] * 128.0))) * 4 + -2;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    if (0x7e < iVar3) {
      iVar3 = 0x7f;
    }
    rectify_buff.data_[uVar4] = (double)iVar3 * 0.0078125;
  }
  dVar9 = exp(-250.0 / local_118);
  dVar8 = 0.0;
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    dVar10 = rectify_buff.data_[uVar4];
    if (dVar10 < dVar8) {
      dVar10 = dVar10 * (1.0 - dVar9) + dVar8 * dVar9;
      rectify_buff.data_[uVar4] = dVar10;
    }
    dVar8 = dVar10;
  }
  stk::StkFrames::StkFrames(&filtered_shifter_buff,nFrames,1);
  firLowpassFilter(&rectify_buff,&filtered_shifter_buff,20.0 / (local_118 * 0.5),local_f0);
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    filtered_shifter_buff.data_[uVar4] =
         filtered_shifter_buff.data_[uVar4] + filtered_shifter_buff.data_[uVar4];
  }
  if (output_envelope != false) {
    stk::StkFrames::StkFrames(&progress_out_buff,(uint)filtered_shifter_buff.size_,1);
    for (lVar6 = 0;
        CONCAT44(filtered_shifter_buff.size_._4_4_,(uint)filtered_shifter_buff.size_) != lVar6;
        lVar6 = lVar6 + 1) {
      dVar8 = filtered_shifter_buff.data_[lVar6] * 0.5;
      progress_out_buff.data_[lVar6] = dVar8;
      SVar11 = 1.0;
      if ((1.0 < dVar8) || (SVar11 = -1.0, dVar8 < -1.0)) {
        progress_out_buff.data_[lVar6] = SVar11;
      }
    }
    std::__cxx11::string::string((string *)&local_a8,"_envelope",&local_119);
    outputBufferToFile(in_file_path,&progress_out_buff,&local_a8,local_118);
    std::__cxx11::string::~string((string *)&local_a8);
    stk::StkFrames::~StkFrames(&progress_out_buff);
  }
  pSVar1 = preprocess_buff->data_;
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    dVar8 = filtered_shifter_buff.data_[uVar4] * local_110;
    filtered_shifter_buff.data_[uVar4] = dVar8;
    pSVar1[uVar4] =
         ((double)(~-(ulong)(local_e8 < 0.0) & (ulong)(dVar8 - local_108) |
                  (ulong)((2.0 - local_108) - dVar8) & -(ulong)(local_e8 < 0.0)) + pSVar1[uVar4]) *
         0.5;
  }
  if (use_linearity_correction) {
    pSVar1 = preprocess_buff->data_;
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      pSVar1[uVar4] = 22368.0 / ((159.79 / (pSVar1[uVar4] * 0.5771522095) + -100.0) * 128.0);
    }
  }
  stk::StkFrames::~StkFrames(&filtered_shifter_buff);
  stk::StkFrames::~StkFrames(&rectify_buff);
  return 0;
}

Assistant:

int preprocessInputBuffer(const std::string &in_file_path,
						  stk::StkFrames &preprocess_buff, double dst_rate,
						  double shifter_weight,
						  int centerBiasLevel, bool use_linearity_correction)
{
	int	src_frames = (int)preprocess_buff.size();
	
	// thresholdの補正
	double centerBiasLevelf = centerBiasLevel;
	if (use_linearity_correction) {
		centerBiasLevelf = 128.0 * linearToDacCurve(centerBiasLevelf);
	}
	
	if (centerBiasLevelf > 63) {
		centerBiasLevelf -= 128;
	}
	double threshold_level = -centerBiasLevelf / 64.0;
	
	// 波形を下半分のみ残して半波整流する
	stk::StkFrames rectify_buff(src_frames, 1);
	for (int i=0; i<src_frames; ++i) {
		if (centerBiasLevelf >= 0) {
			if (preprocess_buff[i] >= threshold_level) {
				rectify_buff[i] = 0;
			}
			else {
				rectify_buff[i] = threshold_level - preprocess_buff[i];
			}
		}
		else {
			if (preprocess_buff[i] >= threshold_level) {
				rectify_buff[i] = preprocess_buff[i] - threshold_level;
			}
			else {
				rectify_buff[i] = 0;
			}
		}
	}
	
	// 先頭2048サンプルの平均値をとって初期値とする
	double start_sample = .0;
	{
		int window_len = (src_frames > 2048)?2048 : src_frames;
		for (int i=0; i<window_len; ++i) {
			start_sample += rectify_buff[i] / static_cast<double>(window_len);
		}
	}
	
	// DPCM変換後に近い波形になるように値が2/128ずつだけ変化するようにする
	{
		int now_sample = 2*static_cast<int>((force_initial_volume >= 0)?(force_initial_volume/2):(start_sample * 64.0));
		for (int i=0; i<src_frames; ++i) {
			double target = rectify_buff[i] * 128;
			if (threshold_level != 1.0) {
				target /= 1.0 - std::fabs(threshold_level);
			}
			if (target > now_sample) {
				now_sample += 2;
			}
			else {
				now_sample -= 2;
			}
			if (now_sample < 0) now_sample = 0;
			if (now_sample > 127) now_sample = 127;
			rectify_buff[i] = now_sample / 128.0;
		}
	}
	
	// ピーク&ホールド
	{
		double env = .0;
		double coeffRR = std::exp(-250.0 / dst_rate);
		for (int i=0; i<src_frames; ++i) {
			if (rectify_buff[i] >= env) {
				env = rectify_buff[i];
			}
			else {
				env *= coeffRR;
				env += (1.0 - coeffRR) * rectify_buff[i];
				rectify_buff[i] = env;
			}
		}
	}
	
//	{
//		stk::StkFrames	progress_out_buff((uint32_t)rectify_buff.size(), 1);
//		for (size_t i=0; i<rectify_buff.size(); ++i) {
//			progress_out_buff[i] = rectify_buff[i];
//			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
//			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
//		}
//		outputBufferToFile(in_file_path, progress_out_buff, "_rectify", dst_rate);
//	}
	
	// 整流波形にLPFを掛けて可聴成分を除去
	stk::StkFrames	filtered_shifter_buff(src_frames, 1);
	firLowpassFilter(rectify_buff,
					 filtered_shifter_buff,
					 20.0 / (dst_rate/2),
					 start_sample);
	// ゲイン調整
	for (int i=0; i<src_frames; ++i) {
		filtered_shifter_buff[i] *= 2.0;
	}
	
	if (output_envelope) {
		// エンベロープ波形
		stk::StkFrames	progress_out_buff((uint32_t)filtered_shifter_buff.size(), 1);
		for (size_t i=0; i<filtered_shifter_buff.size(); ++i) {
			progress_out_buff[i] = filtered_shifter_buff[i] * 0.5;
			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
		}
		outputBufferToFile(in_file_path, progress_out_buff, "_envelope", dst_rate);
	}
	
	// 平滑された整流波形を加算してゲイン調整
	for (int i=0; i<src_frames; ++i) {
		filtered_shifter_buff[i] *= shifter_weight;
		if (centerBiasLevelf >= 0) {
			preprocess_buff[i] += filtered_shifter_buff[i] - threshold_level;
		}
		else {
			preprocess_buff[i] += 2.0 - threshold_level - filtered_shifter_buff[i];
		}
		preprocess_buff[i] *= 0.5;		// シフトによって倍になったピークを1.0に落とす
	}
	
	// 非線形DAC特性の補正
	if (use_linearity_correction) {
		for (int i=0; i<src_frames; ++i) {
			preprocess_buff[i] = 22368.0 / (128 * ((159.79 / (0.5771522095 * preprocess_buff[i])) - 100));
		}
	}
	
	return 0;
}